

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O2

ssize_t __thiscall
anon_unknown.dwarf_2f1133::SyncFixture::read(SyncFixture *this,int __fd,void *__buf,size_t __nbytes)

{
  value_reference_type ppVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  _func_int **message;
  database *db;
  shared_ptr<const_char> value;
  AssertHelper local_218;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  undefined1 local_200 [240];
  const_iterator it;
  
  db = &this->db_;
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&index,db,true);
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::find<std::__cxx11::string,void>
            (&it,(hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
                  *)index.
                    super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,db,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  memset(local_200 + 8,0,0xd8);
  local_200._224_8_ =
       index.
       super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_200._232_8_ = 0;
  local_200._0_8_ = db;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<true>,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<true>>
            ((internal *)&value,"it","index->cend (db_)",&it,(iterator_base<true> *)local_200);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                 *)(local_200 + 0xe8));
  if ((char)value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0') {
    testing::Message::Message((Message *)local_200);
    if (value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      message = (_func_int **)0x1ec539;
    }
    else {
      message = (value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sync.cpp"
               ,0x57,(char *)message);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if ((factory *)local_200._0_8_ != (factory *)0x0) {
      (*(*(_func_int ***)local_200._0_8_)[1])();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ppVar1 = pstore::index::
             hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::iterator_base<true>::operator*(&it);
    pstore::database::getro<char,void>((database *)&value,(extent<char> *)db);
    local_200._0_8_ = (long)local_200 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,
               CONCAT71(value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _1_7_,(char)value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr),
               (ppVar1->second).size +
               CONCAT71(value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _1_7_,(char)value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr));
    std::__cxx11::string::operator=((string *)__buf,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  ::~unique_ptr(&it.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return extraout_RAX;
}

Assistant:

void SyncFixture::read (std::string const & key, std::string * value_out) {
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        auto const it = index->find (db_, key);
        ASSERT_NE (it, index->cend (db_));

        pstore::extent<char> const & r = it->second;
        std::shared_ptr<char const> value = db_.getro (r);
        *value_out = std::string{value.get (), r.size};
    }